

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O0

int __thiscall
CSound::Play(CSound *this,int ChannelID,CSampleHandle SampleID,int Flags,float x,float y)

{
  bool bVar1;
  uint in_ECX;
  int iVar2;
  int in_ESI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float in_XMM1_Da;
  int id;
  int i;
  int VoiceID;
  int local_30;
  int local_2c;
  int local_10;
  CSampleHandle local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ISound::CSampleHandle::IsValid((CSampleHandle *)0x13e8ed);
  if (bVar1) {
    local_2c = -1;
    lock_wait((LOCK)0x13e912);
    for (local_30 = 0; local_30 < 0x40; local_30 = local_30 + 1) {
      iVar2 = (m_NextVoice + local_30) % 0x40;
      if (m_aVoices[iVar2].m_pSample == (CSample *)0x0) {
        m_NextVoice = iVar2 + 1;
        local_2c = iVar2;
        break;
      }
    }
    if (local_2c != -1) {
      iVar2 = ISound::CSampleHandle::Id(&local_c);
      m_aVoices[local_2c].m_pSample = m_aSamples + iVar2;
      m_aVoices[local_2c].m_pChannel = m_aChannels + in_ESI;
      if ((in_ECX & 1) == 0) {
        m_aVoices[local_2c].m_Tick = 0;
      }
      else {
        iVar2 = ISound::CSampleHandle::Id(&local_c);
        m_aVoices[local_2c].m_Tick = m_aSamples[iVar2].m_PausedAt;
      }
      m_aVoices[local_2c].m_Vol = 0xff;
      m_aVoices[local_2c].m_Flags = in_ECX;
      m_aVoices[local_2c].m_X = (int)in_XMM0_Da;
      m_aVoices[local_2c].m_Y = (int)in_XMM1_Da;
    }
    lock_unlock((LOCK)0x13eaaf);
    local_10 = local_2c;
  }
  else {
    local_10 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

int CSound::Play(int ChannelID, CSampleHandle SampleID, int Flags, float x, float y)
{
	if(!SampleID.IsValid())
		return -1;

	int VoiceID = -1;
	int i;

	lock_wait(m_SoundLock);

	// search for voice
	for(i = 0; i < NUM_VOICES; i++)
	{
		int id = (m_NextVoice + i) % NUM_VOICES;
		if(!m_aVoices[id].m_pSample)
		{
			VoiceID = id;
			m_NextVoice = id+1;
			break;
		}
	}

	// voice found, use it
	if(VoiceID != -1)
	{
		m_aVoices[VoiceID].m_pSample = &m_aSamples[SampleID.Id()];
		m_aVoices[VoiceID].m_pChannel = &m_aChannels[ChannelID];
		if(Flags & FLAG_LOOP)
			m_aVoices[VoiceID].m_Tick = m_aSamples[SampleID.Id()].m_PausedAt;
		else
			m_aVoices[VoiceID].m_Tick = 0;
		m_aVoices[VoiceID].m_Vol = 255;
		m_aVoices[VoiceID].m_Flags = Flags;
		m_aVoices[VoiceID].m_X = (int)x;
		m_aVoices[VoiceID].m_Y = (int)y;
	}

	lock_unlock(m_SoundLock);
	return VoiceID;
}